

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt_solver_basis.cc
# Opt level: O3

void __thiscall ipx::KKTSolverBasis::DropPrimal(KKTSolverBasis *this,Iterate *iterate,Info *info)

{
  ipxint *piVar1;
  double dVar2;
  uint dim;
  int iVar3;
  int iVar4;
  Basis *pBVar5;
  pointer piVar6;
  double *pdVar7;
  bool bVar8;
  int iVar9;
  Int IVar10;
  void *__s;
  ostream *poVar11;
  ulong uVar12;
  fmtflags jn;
  ulong uVar13;
  long lVar14;
  fmtflags floatfield;
  long lVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  vector<int,_std::allocator<int>_> candidates;
  Int jb;
  IndexedVector row;
  IndexedVector btran;
  int *local_108;
  iterator iStack_100;
  int *local_f8;
  double local_e8;
  undefined8 uStack_e0;
  Info *local_d8;
  string local_d0;
  IndexedVector local_b0;
  ulong local_80;
  double local_78;
  undefined8 uStack_70;
  IndexedVector local_60;
  
  dim = this->model_->num_rows_;
  uVar13 = (ulong)dim;
  iVar3 = this->model_->num_cols_;
  IndexedVector::IndexedVector(&local_60,dim);
  IndexedVector::IndexedVector(&local_b0,iVar3 + dim);
  local_e8 = (this->control_->parameters_).super_ipx_parameters.ipm_drop_primal;
  (info->super_ipx_info).errflag = 0;
  local_108 = (int *)0x0;
  iStack_100._M_current = (int *)0x0;
  local_f8 = (int *)0x0;
  if (0 < (int)dim) {
    uVar12 = 0;
    local_d8 = info;
    do {
      pBVar5 = this->basis_;
      local_d0._M_dataplus._M_p._0_4_ =
           (pBVar5->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar12];
      iVar3 = (pBVar5->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)local_d0._M_dataplus._M_p];
      if ((-1 < iVar3) && (iVar3 < pBVar5->model_->num_rows_)) {
        dVar16 = (iterate->xl_)._M_data[(int)local_d0._M_dataplus._M_p];
        dVar19 = (iterate->xu_)._M_data[(int)local_d0._M_dataplus._M_p];
        dVar2 = dVar19;
        if (dVar19 >= dVar16) {
          dVar2 = dVar16;
        }
        if ((dVar2 <= local_e8) &&
           (dVar2 < (&iterate->zl_)[dVar19 < dVar16]._M_data[(int)local_d0._M_dataplus._M_p] * 0.01)
           ) {
          if (iStack_100._M_current == local_f8) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_108,iStack_100,(int *)&local_d0);
          }
          else {
            *iStack_100._M_current = (int)local_d0._M_dataplus._M_p;
            iStack_100._M_current = iStack_100._M_current + 1;
          }
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
    if (local_108 != iStack_100._M_current) {
      __s = operator_new(uVar13 * 8);
      memset(__s,0,uVar13 * 8);
      if (0 < (int)dim) {
        piVar6 = (this->basis_->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (this->colscale_)._M_data;
        uVar12 = 0;
        do {
          *(double *)((long)__s + uVar12 * 8) = 1.0 / pdVar7[piVar6[uVar12]];
          uVar12 = uVar12 + 1;
        } while (uVar13 != uVar12);
      }
      if (local_108 != iStack_100._M_current) {
        do {
          iVar3 = iStack_100._M_current[-1];
          pBVar5 = this->basis_;
          iVar9 = pBVar5->model_->num_rows_;
          iVar4 = (pBVar5->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar3];
          if (iVar4 < iVar9) {
            iVar9 = 0;
          }
          iVar9 = iVar4 - iVar9;
          if (iVar4 < 0) {
            iVar9 = -1;
          }
          lVar15 = (long)iVar9;
          local_e8 = *(double *)((long)__s + lVar15 * 8);
          floatfield = _S_boolalpha;
          Basis::TableauRow(pBVar5,iVar3,&local_60,&local_b0,true);
          bVar8 = IndexedVector::sparse(&local_b0);
          if (bVar8) {
            if ((long)local_b0.nnz_ < 1) goto LAB_0039fac5;
            jn = _S_ios_fmtflags_min|_S_ios_fmtflags_max;
            dVar16 = 2.0;
            lVar14 = 0;
            do {
              floatfield = local_b0.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar14];
              if ((1e-07 < ABS(local_b0.elements_._M_data[floatfield])) &&
                 (dVar19 = ABS(local_b0.elements_._M_data[floatfield]) *
                           (this->colscale_)._M_data[floatfield] * local_e8, dVar16 < dVar19)) {
                jn = floatfield;
                dVar16 = dVar19;
              }
              lVar14 = lVar14 + 1;
            } while (local_b0.nnz_ != lVar14);
LAB_0039f989:
            if (jn < ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) goto LAB_0039fac5;
            uVar13 = (ulong)(uint)jn;
            local_e8 = local_b0.elements_._M_data[uVar13];
            uStack_e0 = 0;
            local_78 = ABS(local_e8);
            uStack_70 = 0;
            if (local_78 < 0.001) {
              local_80 = uVar13;
              poVar11 = Control::Debug(this->control_,3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," |pivot| = ",0xb);
              Format_abi_cxx11_(&local_d0,(ipx *)0x0,local_78,2,0x100,floatfield);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,
                                                            (int)local_d0._M_dataplus._M_p),
                                   local_d0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11," (primal basic variable close to bound)\n",0x28);
              uVar13 = local_80;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,(int)local_d0._M_dataplus._M_p) !=
                  &local_d0.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_d0._M_dataplus._M_p._4_4_,
                                         (int)local_d0._M_dataplus._M_p));
              }
            }
            IVar10 = Basis::ExchangeIfStable(this->basis_,iVar3,jn,local_e8,1,(bool *)&local_d0);
            (local_d8->super_ipx_info).errflag = IVar10;
            if (IVar10 != 0) break;
            if ((char)local_d0._M_dataplus._M_p == '\x01') {
              *(double *)((long)__s + lVar15 * 8) = 1.0 / (this->colscale_)._M_data[uVar13];
              piVar1 = &(local_d8->super_ipx_info).updates_ipm;
              *piVar1 = *piVar1 + 1;
              this->basis_changes_ = this->basis_changes_ + 1;
              goto LAB_0039fb56;
            }
          }
          else {
            if (0 < (int)(uint)local_b0.elements_._M_size) {
              jn = _S_ios_fmtflags_min|_S_ios_fmtflags_max;
              dVar16 = 2.0;
              uVar13 = 0;
              do {
                if ((1e-07 < ABS(local_b0.elements_._M_data[uVar13])) &&
                   (dVar19 = ABS(local_b0.elements_._M_data[uVar13]) *
                             (this->colscale_)._M_data[uVar13] * local_e8, dVar16 < dVar19)) {
                  jn = (fmtflags)uVar13;
                  dVar16 = dVar19;
                }
                uVar13 = uVar13 + 1;
              } while (((uint)local_b0.elements_._M_size & 0x7fffffff) != uVar13);
              goto LAB_0039f989;
            }
LAB_0039fac5:
            auVar17._8_8_ = (iterate->zu_)._M_data[iVar3];
            auVar17._0_8_ = (iterate->zl_)._M_data[iVar3];
            auVar18._8_8_ = (iterate->xu_)._M_data[iVar3];
            auVar18._0_8_ = (iterate->xl_)._M_data[iVar3];
            auVar18 = divpd(auVar17,auVar18);
            if (auVar18._0_8_ <= auVar18._8_8_) {
              Iterate::make_implied_ub(iterate,iVar3);
            }
            else {
              Iterate::make_implied_lb(iterate,iVar3);
            }
            Basis::FreeBasicVariable(this->basis_,iVar3);
            *(undefined8 *)((long)__s + lVar15 * 8) = 0;
            (this->colscale_)._M_data[iVar3] = INFINITY;
            piVar1 = &(local_d8->super_ipx_info).primal_dropped;
            *piVar1 = *piVar1 + 1;
LAB_0039fb56:
            iStack_100._M_current = iStack_100._M_current + -1;
          }
        } while (local_108 != iStack_100._M_current);
      }
      operator_delete(__s);
    }
    if (local_108 != (int *)0x0) {
      operator_delete(local_108);
    }
  }
  if (local_b0.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  operator_delete(local_b0.elements_._M_data);
  if (local_60.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  operator_delete(local_60.elements_._M_data);
  return;
}

Assistant:

void KKTSolverBasis::DropPrimal(Iterate* iterate, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& xl = iterate->xl();
    const Vector& xu = iterate->xu();
    const Vector& zl = iterate->zl();
    const Vector& zu = iterate->zu();
    IndexedVector btran(m), row(n+m);
    const double drop_primal = control_.ipm_drop_primal();
    const double volume_tol = 2.0;
    info->errflag = 0;

    std::vector<Int> candidates;
    for (Int p = 0; p < m; p++) {
        Int jb = basis_[p];
        if (basis_.StatusOf(jb) != Basis::BASIC) // ignore free variables
            continue;
        assert(std::isfinite(xl[jb]) || std::isfinite(xu[jb]));
        assert(xl[jb] > 0.0);
        assert(xu[jb] > 0.0);
        double xj, zj;          // choose which bound is nearer
        if (xl[jb] <= xu[jb]) {
            xj = xl[jb];
            zj = zl[jb];
        } else {
            xj = xu[jb];
            zj = zu[jb];
        }
        if (xj < 0.01*zj && xj <= drop_primal)
            candidates.push_back(jb);
    }
    if (candidates.empty())
        return;

    // Maintain a copy of the inverse scaling factors of basic variables for
    // faster access.
    Vector invscale_basic(m);
    for (Int p = 0; p < m; p++) {
        Int j = basis_[p];
        invscale_basic[p] = 1.0 / colscale_[j];
        assert(std::isfinite(invscale_basic[p]));
        assert(invscale_basic[p] >= 0.0);
    }

    while (!candidates.empty()) {
        Int jb = candidates.back();
        Int p = basis_.PositionOf(jb);
        assert(p >= 0);
        // Pivot jb out of the basis if the volume increase sufficiently.
        const double s = invscale_basic[p];
        basis_.TableauRow(jb, btran, row, true);
        Int jmax = -1;
        double vmax = volume_tol;
        auto search_pivot = [&](Int j, double pivot) {
            pivot = std::abs(pivot);
            if (pivot > kPivotZeroTol) {
                double v = pivot * colscale_[j] * s;
                if (v > vmax) {
                    vmax = v;
                    jmax = j;
                }
            }
        };
        for_each_nonzero(row, search_pivot);
        if (jmax >= 0) {
            // Pivot jb out of the basis.
            double pivot = row[jmax];
            if (std::abs(pivot) < 1e-3)
                control_.Debug(3)
                    << " |pivot| = " << sci2(std::abs(pivot))
                    << " (primal basic variable close to bound)\n";
            assert(basis_.StatusOf(jmax) == Basis::NONBASIC);
            bool exchanged;
            info->errflag = basis_.ExchangeIfStable(jb, jmax, pivot, 1,
                                                    &exchanged);
            if (info->errflag)
                return;
            if (!exchanged)     // factorization was unstable, try again
                continue;
            invscale_basic[p] = 1.0 / colscale_[jmax];
            assert(std::isfinite(invscale_basic[p]));
            assert(invscale_basic[p] >= 0.0);
            info->updates_ipm++;
            basis_changes_++;
        } else {
            // Make variable jb "implied" at a bound.
            if (zl[jb]/xl[jb] > zu[jb]/xu[jb])
                iterate->make_implied_lb(jb);
            else
                iterate->make_implied_ub(jb);
            basis_.FreeBasicVariable(jb);
            invscale_basic[p] = 0.0;
            colscale_[jb] = INFINITY;
            info->primal_dropped++;
        }
        candidates.pop_back();
    }
}